

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall fizplex::LPTest_AddLogicals_Test::TestBody(LPTest_AddLogicals_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  size_t sVar3;
  char *pcVar4;
  double in_RDI;
  char *in_R9;
  char *unaff_retaddr;
  char *in_stack_00000008;
  AssertionResult gtest_ar_11;
  int i;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  LP lp;
  bool *in_stack_fffffffffffffc28;
  LP *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  ColType in_stack_fffffffffffffc3c;
  LP *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  undefined7 in_stack_fffffffffffffc50;
  double in_stack_fffffffffffffc58;
  LP *in_stack_fffffffffffffc60;
  RowType in_stack_fffffffffffffc6c;
  LP *in_stack_fffffffffffffc70;
  AssertHelper local_298;
  Message local_290;
  AssertionResult local_288;
  int local_274;
  AssertHelper local_270;
  Message local_268;
  AssertionResult local_260;
  AssertHelper local_250;
  Message local_248;
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228;
  AssertionResult local_220;
  AssertHelper local_210;
  Message local_208;
  AssertionResult local_200;
  AssertHelper local_1f0;
  Message local_1e8;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined4 local_19c;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  undefined4 local_174;
  AssertionResult local_170;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b1;
  AssertionResult local_b0 [10];
  double in_stack_fffffffffffffff0;
  
  LP::LP(in_stack_fffffffffffffc60);
  LP::add_column(in_stack_fffffffffffffc40,in_stack_fffffffffffffc3c,
                 (double)in_stack_fffffffffffffc30,(double)in_stack_fffffffffffffc28,
                 9.26213008683085e-318);
  LP::add_row(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,(double)in_stack_fffffffffffffc60,
              in_stack_fffffffffffffc58);
  LP::add_row(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,(double)in_stack_fffffffffffffc60,
              in_stack_fffffffffffffc58);
  LP::add_row(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,(double)in_stack_fffffffffffffc60,
              in_stack_fffffffffffffc58);
  LP::add_row(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,(double)in_stack_fffffffffffffc60,
              in_stack_fffffffffffffc58);
  LP::add_row(in_stack_fffffffffffffc70,in_stack_fffffffffffffc6c,(double)in_stack_fffffffffffffc60,
              in_stack_fffffffffffffc58);
  LP::add_logicals(in_stack_fffffffffffffc60);
  sVar3 = LP::column_count((LP *)0x1c9bbe);
  local_b1 = sVar3 == 6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,(type *)0x1c9bf5
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_b0,(AssertionResult *)"lp.column_count() == 6","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x87,pcVar4);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message((Message *)0x1c9cfa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c9d75);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_fc = 0;
  testing::internal::EqHelper<false>::Compare<fizplex::ColType,fizplex::ColType>
            (in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
             (ColType *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
             (ColType *)in_stack_fffffffffffffc30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1c9e38);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x89,pcVar4);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x1c9e9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c9ef3);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_124 = 1;
  testing::internal::EqHelper<false>::Compare<fizplex::ColType,fizplex::ColType>
            (in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
             (ColType *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
             (ColType *)in_stack_fffffffffffffc30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1c9fb6);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x1ca019);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca071);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_14c = 2;
  testing::internal::EqHelper<false>::Compare<fizplex::ColType,fizplex::ColType>
            (in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
             (ColType *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
             (ColType *)in_stack_fffffffffffffc30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1ca134);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8b,pcVar4);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x1ca197);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca1ef);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_174 = 3;
  testing::internal::EqHelper<false>::Compare<fizplex::ColType,fizplex::ColType>
            (in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
             (ColType *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
             (ColType *)in_stack_fffffffffffffc30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1ca2b2);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8c,pcVar4);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message((Message *)0x1ca315);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca36d);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  local_19c = 4;
  testing::internal::EqHelper<false>::Compare<fizplex::ColType,fizplex::ColType>
            (in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40,
             (ColType *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
             (ColType *)in_stack_fffffffffffffc30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1ca430);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message((Message *)0x1ca493);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca4e8);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1ca5a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x8f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    testing::Message::~Message((Message *)0x1ca603);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca658);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1ca710);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x90,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message((Message *)0x1ca773);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca7c8);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_200);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1ca874);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x91,pcVar4);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message((Message *)0x1ca8d1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ca926);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_220);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1ca9d2);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x92,pcVar4);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message((Message *)0x1caa2f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1caa84);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x1cab30);
    testing::internal::AssertHelper::AssertHelper
              (&local_250,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x93,pcVar4);
    testing::internal::AssertHelper::operator=(&local_250,&local_248);
    testing::internal::AssertHelper::~AssertHelper(&local_250);
    testing::Message::~Message((Message *)0x1cab8d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cabe2);
  LP::column_header(in_stack_fffffffffffffc40,
                    CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38));
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_260);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_268);
    in_stack_fffffffffffffc48 =
         testing::AssertionResult::failure_message((AssertionResult *)0x1cac93);
    testing::internal::AssertHelper::AssertHelper
              (&local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
               ,0x94,in_stack_fffffffffffffc48);
    testing::internal::AssertHelper::operator=(&local_270,&local_268);
    testing::internal::AssertHelper::~AssertHelper(&local_270);
    testing::Message::~Message((Message *)0x1cacf0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1cad48);
  for (local_274 = 0; local_274 < 5; local_274 = local_274 + 1) {
    in_stack_fffffffffffffc40 =
         (LP *)LP::get_value((LP *)CONCAT17(uVar2,in_stack_fffffffffffffc50),
                             (size_t)in_stack_fffffffffffffc48,(size_t)in_stack_fffffffffffffc40);
    testing::internal::CmpHelperFloatingPointEQ<double>
              (in_stack_00000008,unaff_retaddr,in_RDI,in_stack_fffffffffffffff0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar1) {
      testing::Message::Message(&local_290);
      in_stack_fffffffffffffc30 =
           (LP *)testing::AssertionResult::failure_message((AssertionResult *)0x1cae19);
      testing::internal::AssertHelper::AssertHelper
                (&local_298,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp_test.cc"
                 ,0x97,(char *)in_stack_fffffffffffffc30);
      testing::internal::AssertHelper::operator=(&local_298,&local_290);
      testing::internal::AssertHelper::~AssertHelper(&local_298);
      testing::Message::~Message((Message *)0x1cae76);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1caecb);
  }
  LP::~LP(in_stack_fffffffffffffc30);
  return;
}

Assistant:

TEST(LPTest, AddLogicals) {
  LP lp;
  lp.add_column(ColType::Bounded, 0, 5);
  lp.add_row(RowType::Equality, 1, 1);
  lp.add_row(RowType::Range, 3, 15);
  lp.add_row(RowType::LE, -inf, 7);
  lp.add_row(RowType::NonBinding, -inf, inf);
  lp.add_row(RowType::GE, 3, inf);
  lp.add_logicals();

  EXPECT_TRUE(lp.column_count() == 6);

  EXPECT_EQ(lp.column_header(1).type, ColType::Fixed);
  EXPECT_EQ(lp.column_header(2).type, ColType::Bounded);
  EXPECT_EQ(lp.column_header(3).type, ColType::LowerBound);
  EXPECT_EQ(lp.column_header(4).type, ColType::Free);
  EXPECT_EQ(lp.column_header(5).type, ColType::UpperBound);

  EXPECT_DOUBLE_EQ(0.0, lp.column_header(1).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(1).upper);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(2).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(3).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(5).upper);
  EXPECT_DOUBLE_EQ(12.0, lp.column_header(2).upper);

  for (int i = 0; i < 5; i++)
    EXPECT_DOUBLE_EQ(1.0, lp.get_value(i, 1 + i));
}